

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint8_avx2.h
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::ObjectIntersectorK<8,_false>_>,_false>
     ::intersectCoherent(vint<8> *valid_i,Intersectors *This,RayHitK<8> *ray,
                        RayQueryContext *context)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  uint uVar15;
  undefined4 uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  _func_int **pp_Var20;
  ulong *puVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  NodeRef nodeRef;
  ulong uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  vint4 bi;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  vint8 bi_1;
  vfloat<4> fmin;
  vint<8> octant;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  RTCIntersectFunctionNArguments local_1350;
  Geometry *local_1320;
  undefined8 local_1318;
  RTCIntersectArguments *local_1310;
  AccelData *local_1308;
  ulong local_1300;
  RayHitK<8> *local_12f8;
  RayQueryContext *local_12f0;
  ulong local_12e8;
  long local_12e0;
  long local_12d8;
  ulong local_12d0;
  ulong local_12c8;
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  uint local_1270;
  uint uStack_126c;
  uint uStack_1268;
  uint uStack_1264;
  undefined4 local_1260;
  undefined4 uStack_125c;
  undefined4 uStack_1258;
  undefined4 uStack_1254;
  uint local_1250;
  uint uStack_124c;
  uint uStack_1248;
  uint uStack_1244;
  undefined1 local_1240 [16];
  undefined1 local_1230 [16];
  undefined1 local_1220 [16];
  uint local_1210;
  uint uStack_120c;
  uint uStack_1208;
  uint uStack_1204;
  float local_1200;
  float fStack_11fc;
  float fStack_11f8;
  float fStack_11f4;
  uint local_11f0;
  uint uStack_11ec;
  uint uStack_11e8;
  uint uStack_11e4;
  undefined1 local_11e0 [16];
  undefined1 local_11d0 [16];
  undefined1 local_11c0 [16];
  uint local_11b0;
  uint uStack_11ac;
  uint uStack_11a8;
  uint uStack_11a4;
  float local_11a0;
  float fStack_119c;
  float fStack_1198;
  float fStack_1194;
  undefined4 local_1190;
  undefined4 uStack_118c;
  undefined4 uStack_1188;
  undefined4 uStack_1184;
  undefined1 local_1180 [32];
  float local_1160;
  float fStack_115c;
  float fStack_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  undefined4 uStack_1144;
  float local_1140;
  float fStack_113c;
  float fStack_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float fStack_1128;
  undefined4 uStack_1124;
  float local_1120;
  float fStack_111c;
  float fStack_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float fStack_1108;
  undefined4 uStack_1104;
  undefined1 local_1100 [32];
  undefined4 local_10e0;
  undefined4 uStack_10dc;
  undefined4 uStack_10d8;
  undefined4 uStack_10d4;
  undefined4 uStack_10d0;
  undefined4 uStack_10cc;
  undefined4 uStack_10c8;
  undefined4 uStack_10c4;
  undefined1 local_10c0 [32];
  float local_10a0;
  float fStack_109c;
  float fStack_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float fStack_1088;
  undefined4 uStack_1084;
  float local_1080;
  float fStack_107c;
  float fStack_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float fStack_1068;
  undefined4 uStack_1064;
  float local_1060;
  float fStack_105c;
  float fStack_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float fStack_1048;
  undefined4 uStack_1044;
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined1 local_fc0 [32];
  ulong local_fa0;
  undefined4 local_f98 [2];
  ulong local_f90 [492];
  undefined1 auVar32 [64];
  
  auVar36 = vpcmpeqd_avx2(in_ZMM0._0_32_,in_ZMM0._0_32_);
  auVar29 = vpcmpeqd_avx2(auVar36,(undefined1  [32])valid_i->field_0);
  uVar15 = vmovmskps_avx(auVar29);
  if (uVar15 == 0) {
    return;
  }
  local_1308 = This->ptr;
  local_1300 = (ulong)(uVar15 & 0xff);
  auVar4 = *(undefined1 (*) [32])(ray + 0x80);
  auVar41._8_4_ = 0x7fffffff;
  auVar41._0_8_ = 0x7fffffff7fffffff;
  auVar41._12_4_ = 0x7fffffff;
  auVar41._16_4_ = 0x7fffffff;
  auVar41._20_4_ = 0x7fffffff;
  auVar41._24_4_ = 0x7fffffff;
  auVar41._28_4_ = 0x7fffffff;
  auVar47._8_4_ = 0x219392ef;
  auVar47._0_8_ = 0x219392ef219392ef;
  auVar47._12_4_ = 0x219392ef;
  auVar47._16_4_ = 0x219392ef;
  auVar47._20_4_ = 0x219392ef;
  auVar47._24_4_ = 0x219392ef;
  auVar47._28_4_ = 0x219392ef;
  auVar30 = vandps_avx(auVar4,auVar41);
  auVar30 = vcmpps_avx(auVar30,auVar47,1);
  auVar43 = vblendvps_avx(auVar4,auVar47,auVar30);
  auVar30 = *(undefined1 (*) [32])(ray + 0xa0);
  auVar38 = vandps_avx(auVar30,auVar41);
  auVar38 = vcmpps_avx(auVar38,auVar47,1);
  auVar44 = vblendvps_avx(auVar30,auVar47,auVar38);
  auVar38 = *(undefined1 (*) [32])(ray + 0xc0);
  auVar41 = vandps_avx(auVar38,auVar41);
  auVar41 = vcmpps_avx(auVar41,auVar47,1);
  auVar8 = vrcpps_avx(auVar43);
  auVar41 = vblendvps_avx(auVar38,auVar47,auVar41);
  auVar42._8_4_ = 0x3f800000;
  auVar42._0_8_ = 0x3f8000003f800000;
  auVar42._12_4_ = 0x3f800000;
  auVar42._16_4_ = 0x3f800000;
  auVar42._20_4_ = 0x3f800000;
  auVar42._24_4_ = 0x3f800000;
  auVar42._28_4_ = 0x3f800000;
  auVar9 = vfnmadd213ps_fma(auVar43,auVar8,auVar42);
  auVar43 = vrcpps_avx(auVar44);
  auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar8,auVar8);
  auVar55 = ZEXT1664(auVar9);
  auVar8 = vrcpps_avx(auVar41);
  auVar10 = vfnmadd213ps_fma(auVar44,auVar43,auVar42);
  auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar43,auVar43);
  auVar56 = ZEXT1664(auVar10);
  auVar11 = vfnmadd213ps_fma(auVar41,auVar8,auVar42);
  auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar8,auVar8);
  auVar57 = ZEXT1664(auVar11);
  local_1180 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),ZEXT832(0) << 0x20);
  local_10c0 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT832(0) << 0x20);
  auVar41 = ZEXT832(0) << 0x20;
  auVar4 = vcmpps_avx(auVar4,auVar41,1);
  auVar43._8_4_ = 1;
  auVar43._0_8_ = 0x100000001;
  auVar43._12_4_ = 1;
  auVar43._16_4_ = 1;
  auVar43._20_4_ = 1;
  auVar43._24_4_ = 1;
  auVar43._28_4_ = 1;
  auVar4 = vandps_avx(auVar4,auVar43);
  auVar30 = vcmpps_avx(auVar30,auVar41,1);
  auVar44._8_4_ = 2;
  auVar44._0_8_ = 0x200000002;
  auVar44._12_4_ = 2;
  auVar44._16_4_ = 2;
  auVar44._20_4_ = 2;
  auVar44._24_4_ = 2;
  auVar44._28_4_ = 2;
  auVar30 = vandps_avx(auVar30,auVar44);
  auVar30 = vorps_avx(auVar30,auVar4);
  auVar4 = vcmpps_avx(auVar38,auVar41,1);
  auVar38._8_4_ = 4;
  auVar38._0_8_ = 0x400000004;
  auVar38._12_4_ = 4;
  auVar38._16_4_ = 4;
  auVar38._20_4_ = 4;
  auVar38._24_4_ = 4;
  auVar38._28_4_ = 4;
  auVar4 = vandps_avx(auVar4,auVar38);
  auVar36 = vpor_avx2(auVar29 ^ auVar36,auVar4);
  local_1100 = vpor_avx2(auVar36,auVar30);
  local_1060 = *(float *)ray;
  fStack_105c = *(float *)(ray + 4);
  fStack_1058 = *(float *)(ray + 8);
  fStack_1054 = *(float *)(ray + 0xc);
  fStack_1050 = *(float *)(ray + 0x10);
  fStack_104c = *(float *)(ray + 0x14);
  fStack_1048 = *(float *)(ray + 0x18);
  uStack_1044 = *(undefined4 *)(ray + 0x1c);
  local_1080 = *(float *)(ray + 0x20);
  fStack_107c = *(float *)(ray + 0x24);
  fStack_1078 = *(float *)(ray + 0x28);
  fStack_1074 = *(float *)(ray + 0x2c);
  fStack_1070 = *(float *)(ray + 0x30);
  fStack_106c = *(float *)(ray + 0x34);
  fStack_1068 = *(float *)(ray + 0x38);
  uStack_1064 = *(undefined4 *)(ray + 0x3c);
  local_10a0 = *(float *)(ray + 0x40);
  fStack_109c = *(float *)(ray + 0x44);
  fStack_1098 = *(float *)(ray + 0x48);
  fStack_1094 = *(float *)(ray + 0x4c);
  fStack_1090 = *(float *)(ray + 0x50);
  fStack_108c = *(float *)(ray + 0x54);
  fStack_1088 = *(float *)(ray + 0x58);
  uStack_1084 = *(undefined4 *)(ray + 0x5c);
  local_1270 = 0x80000000;
  uStack_126c = 0x80000000;
  uStack_1268 = 0x80000000;
  uStack_1264 = 0x80000000;
  local_10e0 = 0x7f800000;
  uStack_10dc = 0x7f800000;
  uStack_10d8 = 0x7f800000;
  uStack_10d4 = 0x7f800000;
  uStack_10d0 = 0x7f800000;
  uStack_10cc = 0x7f800000;
  uStack_10c8 = 0x7f800000;
  uStack_10c4 = 0x7f800000;
  local_1000 = ZEXT1632(auVar9);
  local_1020 = ZEXT1632(auVar10);
  local_1040 = ZEXT1632(auVar11);
  local_1120 = auVar9._0_4_ * -*(float *)ray;
  fStack_111c = auVar9._4_4_ * -*(float *)(ray + 4);
  fStack_1118 = auVar9._8_4_ * -*(float *)(ray + 8);
  fStack_1114 = auVar9._12_4_ * -*(float *)(ray + 0xc);
  fStack_1110 = -*(float *)(ray + 0x10) * 0.0;
  fStack_110c = -*(float *)(ray + 0x14) * 0.0;
  fStack_1108 = -*(float *)(ray + 0x18) * 0.0;
  uStack_1104 = *(undefined4 *)(ray + 0x1c);
  local_1140 = auVar10._0_4_ * -*(float *)(ray + 0x20);
  fStack_113c = auVar10._4_4_ * -*(float *)(ray + 0x24);
  fStack_1138 = auVar10._8_4_ * -*(float *)(ray + 0x28);
  fStack_1134 = auVar10._12_4_ * -*(float *)(ray + 0x2c);
  fStack_1130 = -*(float *)(ray + 0x30) * 0.0;
  fStack_112c = -*(float *)(ray + 0x34) * 0.0;
  fStack_1128 = -*(float *)(ray + 0x38) * 0.0;
  uStack_1124 = *(undefined4 *)(ray + 0x3c);
  local_1160 = auVar11._0_4_ * -*(float *)(ray + 0x40);
  fStack_115c = auVar11._4_4_ * -*(float *)(ray + 0x44);
  fStack_1158 = auVar11._8_4_ * -*(float *)(ray + 0x48);
  fStack_1154 = auVar11._12_4_ * -*(float *)(ray + 0x4c);
  fStack_1150 = -*(float *)(ray + 0x50) * 0.0;
  fStack_114c = -*(float *)(ray + 0x54) * 0.0;
  fStack_1148 = -*(float *)(ray + 0x58) * 0.0;
  uStack_1144 = *(undefined4 *)(ray + 0x5c);
  local_12f8 = ray;
  local_12f0 = context;
LAB_0161c43a:
  lVar22 = 0;
  for (uVar25 = local_1300; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
    lVar22 = lVar22 + 1;
  }
  uVar16 = *(undefined4 *)(local_1100 + lVar22 * 4);
  auVar29._4_4_ = uVar16;
  auVar29._0_4_ = uVar16;
  auVar29._8_4_ = uVar16;
  auVar29._12_4_ = uVar16;
  auVar29._16_4_ = uVar16;
  auVar29._20_4_ = uVar16;
  auVar29._24_4_ = uVar16;
  auVar29._28_4_ = uVar16;
  auVar30 = vpcmpeqd_avx2(auVar29,local_1100);
  uVar16 = vmovmskps_avx(auVar30);
  local_1300 = ~CONCAT44((int)((ulong)lVar22 >> 0x20),uVar16) & local_1300;
  auVar14._4_4_ = fStack_105c;
  auVar14._0_4_ = local_1060;
  auVar14._8_4_ = fStack_1058;
  auVar14._12_4_ = fStack_1054;
  auVar14._16_4_ = fStack_1050;
  auVar14._20_4_ = fStack_104c;
  auVar14._24_4_ = fStack_1048;
  auVar14._28_4_ = uStack_1044;
  auVar49._8_4_ = 0x7f800000;
  auVar49._0_8_ = 0x7f8000007f800000;
  auVar49._12_4_ = 0x7f800000;
  auVar49._16_4_ = 0x7f800000;
  auVar49._20_4_ = 0x7f800000;
  auVar49._24_4_ = 0x7f800000;
  auVar49._28_4_ = 0x7f800000;
  auVar36 = vblendvps_avx(auVar49,auVar14,auVar30);
  auVar29 = vshufps_avx(auVar36,auVar36,0xb1);
  auVar36 = vminps_avx(auVar36,auVar29);
  auVar29 = vshufpd_avx(auVar36,auVar36,5);
  auVar36 = vminps_avx(auVar36,auVar29);
  auVar9 = vminps_avx(auVar36._0_16_,auVar36._16_16_);
  auVar8._4_4_ = fStack_107c;
  auVar8._0_4_ = local_1080;
  auVar8._8_4_ = fStack_1078;
  auVar8._12_4_ = fStack_1074;
  auVar8._16_4_ = fStack_1070;
  auVar8._20_4_ = fStack_106c;
  auVar8._24_4_ = fStack_1068;
  auVar8._28_4_ = uStack_1064;
  auVar36 = vblendvps_avx(auVar49,auVar8,auVar30);
  auVar29 = vshufps_avx(auVar36,auVar36,0xb1);
  auVar36 = vminps_avx(auVar36,auVar29);
  auVar29 = vshufpd_avx(auVar36,auVar36,5);
  auVar36 = vminps_avx(auVar36,auVar29);
  auVar10 = vminps_avx(auVar36._0_16_,auVar36._16_16_);
  auVar4._4_4_ = fStack_109c;
  auVar4._0_4_ = local_10a0;
  auVar4._8_4_ = fStack_1098;
  auVar4._12_4_ = fStack_1094;
  auVar4._16_4_ = fStack_1090;
  auVar4._20_4_ = fStack_108c;
  auVar4._24_4_ = fStack_1088;
  auVar4._28_4_ = uStack_1084;
  auVar36 = vblendvps_avx(auVar49,auVar4,auVar30);
  auVar10 = vunpcklps_avx(auVar9,auVar10);
  auVar29 = vshufps_avx(auVar36,auVar36,0xb1);
  auVar36 = vminps_avx(auVar36,auVar29);
  auVar29 = vshufpd_avx(auVar36,auVar36,5);
  auVar36 = vminps_avx(auVar36,auVar29);
  auVar9 = vminps_avx(auVar36._0_16_,auVar36._16_16_);
  auVar11 = vinsertps_avx(auVar10,auVar9,0x28);
  auVar50._8_4_ = 0xff800000;
  auVar50._0_8_ = 0xff800000ff800000;
  auVar50._12_4_ = 0xff800000;
  auVar50._16_4_ = 0xff800000;
  auVar50._20_4_ = 0xff800000;
  auVar50._24_4_ = 0xff800000;
  auVar50._28_4_ = 0xff800000;
  auVar36 = vblendvps_avx(auVar50,auVar14,auVar30);
  auVar29 = vshufps_avx(auVar36,auVar36,0xb1);
  auVar36 = vmaxps_avx(auVar36,auVar29);
  auVar29 = vshufpd_avx(auVar36,auVar36,5);
  auVar36 = vmaxps_avx(auVar36,auVar29);
  auVar9 = vmaxps_avx(auVar36._0_16_,auVar36._16_16_);
  auVar36 = vblendvps_avx(auVar50,auVar8,auVar30);
  auVar29 = vshufps_avx(auVar36,auVar36,0xb1);
  auVar36 = vmaxps_avx(auVar36,auVar29);
  auVar29 = vshufpd_avx(auVar36,auVar36,5);
  auVar36 = vmaxps_avx(auVar36,auVar29);
  auVar10 = vmaxps_avx(auVar36._0_16_,auVar36._16_16_);
  auVar10 = vunpcklps_avx(auVar9,auVar10);
  auVar36 = vblendvps_avx(auVar50,auVar4,auVar30);
  auVar29 = vshufps_avx(auVar36,auVar36,0xb1);
  auVar36 = vmaxps_avx(auVar36,auVar29);
  auVar29 = vshufpd_avx(auVar36,auVar36,5);
  auVar36 = vmaxps_avx(auVar36,auVar29);
  auVar9 = vmaxps_avx(auVar36._0_16_,auVar36._16_16_);
  auVar6 = vinsertps_avx(auVar10,auVar9,0x28);
  auVar36 = vblendvps_avx(auVar49,auVar55._0_32_,auVar30);
  auVar29 = vshufps_avx(auVar36,auVar36,0xb1);
  auVar36 = vminps_avx(auVar36,auVar29);
  auVar29 = vshufpd_avx(auVar36,auVar36,5);
  auVar36 = vminps_avx(auVar36,auVar29);
  auVar9 = vminps_avx(auVar36._0_16_,auVar36._16_16_);
  auVar36 = vblendvps_avx(auVar49,auVar56._0_32_,auVar30);
  auVar29 = vshufps_avx(auVar36,auVar36,0xb1);
  auVar36 = vminps_avx(auVar36,auVar29);
  auVar29 = vshufpd_avx(auVar36,auVar36,5);
  auVar36 = vminps_avx(auVar36,auVar29);
  auVar10 = vminps_avx(auVar36._0_16_,auVar36._16_16_);
  auVar36 = vblendvps_avx(auVar49,auVar57._0_32_,auVar30);
  auVar10 = vunpcklps_avx(auVar9,auVar10);
  auVar29 = vshufps_avx(auVar36,auVar36,0xb1);
  auVar36 = vminps_avx(auVar36,auVar29);
  auVar29 = vshufpd_avx(auVar36,auVar36,5);
  auVar36 = vminps_avx(auVar36,auVar29);
  auVar9 = vminps_avx(auVar36._0_16_,auVar36._16_16_);
  auVar40 = vinsertps_avx(auVar10,auVar9,0x28);
  auVar36 = vblendvps_avx(auVar50,auVar55._0_32_,auVar30);
  auVar29 = vshufps_avx(auVar36,auVar36,0xb1);
  auVar36 = vmaxps_avx(auVar36,auVar29);
  auVar29 = vshufpd_avx(auVar36,auVar36,5);
  auVar36 = vmaxps_avx(auVar36,auVar29);
  auVar9 = vmaxps_avx(auVar36._0_16_,auVar36._16_16_);
  auVar36 = vblendvps_avx(auVar50,auVar56._0_32_,auVar30);
  auVar29 = vshufps_avx(auVar36,auVar36,0xb1);
  auVar36 = vmaxps_avx(auVar36,auVar29);
  auVar29 = vshufpd_avx(auVar36,auVar36,5);
  auVar36 = vmaxps_avx(auVar36,auVar29);
  auVar10 = vmaxps_avx(auVar36._0_16_,auVar36._16_16_);
  auVar10 = vunpcklps_avx(auVar9,auVar10);
  auVar36 = vblendvps_avx(auVar50,auVar57._0_32_,auVar30);
  auVar29 = vshufps_avx(auVar36,auVar36,0xb1);
  auVar36 = vmaxps_avx(auVar36,auVar29);
  auVar29 = vshufpd_avx(auVar36,auVar36,5);
  auVar36 = vmaxps_avx(auVar36,auVar29);
  auVar9 = vmaxps_avx(auVar36._0_16_,auVar36._16_16_);
  auVar46 = vinsertps_avx(auVar10,auVar9,0x28);
  auVar36 = vblendvps_avx(auVar49,local_1180,auVar30);
  auVar29 = vshufps_avx(auVar36,auVar36,0xb1);
  auVar36 = vminps_avx(auVar36,auVar29);
  auVar29 = vshufpd_avx(auVar36,auVar36,5);
  auVar29 = vminps_avx(auVar36,auVar29);
  local_12c0 = vblendvps_avx(auVar50,local_10c0,auVar30);
  auVar36 = vshufps_avx(local_12c0,local_12c0,0xb1);
  auVar36 = vmaxps_avx(local_12c0,auVar36);
  auVar4 = vshufpd_avx(auVar36,auVar36,5);
  auVar36 = vmaxps_avx(auVar36,auVar4);
  auVar5 = vcmpps_avx(auVar40,_DAT_01f45a50,5);
  auVar9 = vblendvps_avx(auVar46,auVar40,auVar5);
  auVar10 = vblendvps_avx(auVar11,auVar6,auVar5);
  auVar11 = vblendvps_avx(auVar6,auVar11,auVar5);
  local_11a0 = auVar9._0_4_;
  auVar6 = vmovshdup_avx(auVar9);
  local_12c8 = (ulong)(auVar6._0_4_ < 0.0) << 4 | 0x20;
  auVar6 = vshufpd_avx(auVar9,auVar9,1);
  uVar27 = (ulong)(auVar6._0_4_ < 0.0) << 4 | 0x40;
  local_12d0 = local_12c8 ^ 0x10;
  auVar7 = vminps_avx(auVar29._0_16_,auVar29._16_16_);
  auVar6 = vmaxss_avx(auVar36._0_16_,auVar36._16_16_);
  auVar54 = ZEXT864(0) << 0x20;
  auVar5 = vblendvps_avx(auVar40,auVar46,auVar5);
  auVar51 = ZEXT3264(CONCAT428(uStack_1104,
                               CONCAT424(fStack_1108,
                                         CONCAT420(fStack_110c,
                                                   CONCAT416(fStack_1110,
                                                             CONCAT412(fStack_1114,
                                                                       CONCAT48(fStack_1118,
                                                                                CONCAT44(fStack_111c
                                                                                         ,local_1120
                                                                                        ))))))));
  auVar40._0_4_ = auVar10._0_4_ * local_11a0;
  auVar40._4_4_ = auVar10._4_4_ * auVar9._4_4_;
  auVar40._8_4_ = auVar10._8_4_ * auVar9._8_4_;
  auVar40._12_4_ = auVar10._12_4_ * auVar9._12_4_;
  auVar52 = ZEXT3264(CONCAT428(uStack_1124,
                               CONCAT424(fStack_1128,
                                         CONCAT420(fStack_112c,
                                                   CONCAT416(fStack_1130,
                                                             CONCAT412(fStack_1134,
                                                                       CONCAT48(fStack_1138,
                                                                                CONCAT44(fStack_113c
                                                                                         ,local_1140
                                                                                        ))))))));
  local_1200 = auVar5._0_4_;
  auVar46._0_4_ = auVar11._0_4_ * local_1200;
  auVar46._4_4_ = auVar11._4_4_ * auVar5._4_4_;
  auVar46._8_4_ = auVar11._8_4_ * auVar5._8_4_;
  auVar46._12_4_ = auVar11._12_4_ * auVar5._12_4_;
  auVar53 = ZEXT3264(CONCAT428(uStack_1144,
                               CONCAT424(fStack_1148,
                                         CONCAT420(fStack_114c,
                                                   CONCAT416(fStack_1150,
                                                             CONCAT412(fStack_1154,
                                                                       CONCAT48(fStack_1158,
                                                                                CONCAT44(fStack_115c
                                                                                         ,local_1160
                                                                                        ))))))));
  uVar25 = (ulong)(local_11a0 < 0.0) << 4;
  uVar26 = uVar25 ^ 0x10;
  local_fa0 = *(ulong *)&local_1308[1].bounds.bounds0.lower.field_0;
  local_f98[0] = 0;
  fStack_119c = local_11a0;
  fStack_1198 = local_11a0;
  fStack_1194 = local_11a0;
  local_11b0 = local_1270 ^ (uint)auVar40._0_4_;
  uStack_11ac = uStack_126c ^ (uint)auVar40._0_4_;
  uStack_11a8 = uStack_1268 ^ (uint)auVar40._0_4_;
  uStack_11a4 = uStack_1264 ^ (uint)auVar40._0_4_;
  local_11c0 = vshufps_avx(auVar9,auVar9,0x55);
  auVar10 = vshufps_avx(auVar40,auVar40,0x55);
  local_11d0._0_4_ = local_1270 ^ auVar10._0_4_;
  local_11d0._4_4_ = uStack_126c ^ auVar10._4_4_;
  local_11d0._8_4_ = uStack_1268 ^ auVar10._8_4_;
  local_11d0._12_4_ = uStack_1264 ^ auVar10._12_4_;
  local_11e0 = vshufps_avx(auVar9,auVar9,0xaa);
  auVar9 = vshufps_avx(auVar40,auVar40,0xaa);
  local_11f0 = local_1270 ^ auVar9._0_4_;
  uStack_11ec = uStack_126c ^ auVar9._4_4_;
  uStack_11e8 = uStack_1268 ^ auVar9._8_4_;
  uStack_11e4 = uStack_1264 ^ auVar9._12_4_;
  fStack_11fc = local_1200;
  fStack_11f8 = local_1200;
  fStack_11f4 = local_1200;
  local_1210 = local_1270 ^ (uint)auVar46._0_4_;
  uStack_120c = uStack_126c ^ (uint)auVar46._0_4_;
  uStack_1208 = uStack_1268 ^ (uint)auVar46._0_4_;
  uStack_1204 = uStack_1264 ^ (uint)auVar46._0_4_;
  local_1220 = vshufps_avx(auVar5,auVar5,0x55);
  auVar9 = vshufps_avx(auVar46,auVar46,0x55);
  local_1230._0_4_ = local_1270 ^ auVar9._0_4_;
  local_1230._4_4_ = uStack_126c ^ auVar9._4_4_;
  local_1230._8_4_ = uStack_1268 ^ auVar9._8_4_;
  local_1230._12_4_ = uStack_1264 ^ auVar9._12_4_;
  local_1240 = vshufps_avx(auVar5,auVar5,0xaa);
  auVar9 = vshufps_avx(auVar46,auVar46,0xaa);
  local_1250 = local_1270 ^ auVar9._0_4_;
  uStack_124c = uStack_126c ^ auVar9._4_4_;
  uStack_1248 = uStack_1268 ^ auVar9._8_4_;
  uStack_1244 = uStack_1264 ^ auVar9._12_4_;
  local_1260 = auVar7._0_4_;
  uStack_125c = local_1260;
  uStack_1258 = local_1260;
  uStack_1254 = local_1260;
  auVar36._4_4_ = uStack_10dc;
  auVar36._0_4_ = local_10e0;
  auVar36._8_4_ = uStack_10d8;
  auVar36._12_4_ = uStack_10d4;
  auVar36._16_4_ = uStack_10d0;
  auVar36._20_4_ = uStack_10cc;
  auVar36._24_4_ = uStack_10c8;
  auVar36._28_4_ = uStack_10c4;
  local_fc0 = vblendvps_avx(auVar36,local_1180,auVar30);
  puVar21 = local_f90;
  local_12e8 = uVar25;
  do {
    local_1190 = auVar6._0_4_;
    uStack_118c = local_1190;
    uStack_1188 = local_1190;
    uStack_1184 = local_1190;
LAB_0161c87c:
    do {
      do {
        do {
          if (puVar21 == &local_fa0) {
            if (local_1300 == 0) {
              return;
            }
            goto LAB_0161c43a;
          }
          uVar16 = (undefined4)puVar21[-1];
          auVar30._4_4_ = uVar16;
          auVar30._0_4_ = uVar16;
          auVar30._8_4_ = uVar16;
          auVar30._12_4_ = uVar16;
          auVar30._16_4_ = uVar16;
          auVar30._20_4_ = uVar16;
          auVar30._24_4_ = uVar16;
          auVar30._28_4_ = uVar16;
          auVar32 = ZEXT3264(auVar30);
          puVar21 = puVar21 + -2;
          auVar36 = vcmpps_avx(auVar30,local_12c0,1);
        } while ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                      (auVar36 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar36 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    SUB321(auVar36 >> 0x7f,0) == '\0') &&
                   (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  SUB321(auVar36 >> 0xbf,0) == '\0') &&
                 (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 -1 < auVar36[0x1f]);
        uVar17 = *puVar21;
        while ((uVar17 & 8) == 0) {
          auVar9._4_4_ = uStack_11ac;
          auVar9._0_4_ = local_11b0;
          auVar9._8_4_ = uStack_11a8;
          auVar9._12_4_ = uStack_11a4;
          auVar12._4_4_ = fStack_119c;
          auVar12._0_4_ = local_11a0;
          auVar12._8_4_ = fStack_1198;
          auVar12._12_4_ = fStack_1194;
          auVar9 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar17 + 0x20 + uVar25),auVar9,auVar12);
          auVar10 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar17 + 0x20 + local_12c8),local_11d0,
                                    local_11c0);
          auVar9 = vpmaxsd_avx(auVar9,auVar10);
          auVar7._4_4_ = uStack_11ec;
          auVar7._0_4_ = local_11f0;
          auVar7._8_4_ = uStack_11e8;
          auVar7._12_4_ = uStack_11e4;
          auVar10 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar17 + 0x20 + uVar27),auVar7,local_11e0
                                   );
          auVar11._4_4_ = uStack_125c;
          auVar11._0_4_ = local_1260;
          auVar11._8_4_ = uStack_1258;
          auVar11._12_4_ = uStack_1254;
          auVar10 = vpmaxsd_avx(auVar10,auVar11);
          auVar9 = vpmaxsd_avx(auVar9,auVar10);
          auVar10._4_4_ = uStack_120c;
          auVar10._0_4_ = local_1210;
          auVar10._8_4_ = uStack_1208;
          auVar10._12_4_ = uStack_1204;
          auVar6._4_4_ = fStack_11fc;
          auVar6._0_4_ = local_1200;
          auVar6._8_4_ = fStack_11f8;
          auVar6._12_4_ = fStack_11f4;
          auVar10 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar17 + 0x20 + uVar26),auVar10,auVar6);
          auVar11 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar17 + 0x20 + local_12d0),local_1230,
                                    local_1220);
          auVar10 = vpminsd_avx(auVar10,auVar11);
          auVar5._4_4_ = uStack_124c;
          auVar5._0_4_ = local_1250;
          auVar5._8_4_ = uStack_1248;
          auVar5._12_4_ = uStack_1244;
          auVar11 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar17 + 0x20 + (uVar27 ^ 0x10)),auVar5,
                                    local_1240);
          auVar13._4_4_ = uStack_118c;
          auVar13._0_4_ = local_1190;
          auVar13._8_4_ = uStack_1188;
          auVar13._12_4_ = uStack_1184;
          auVar11 = vpminsd_avx(auVar11,auVar13);
          auVar10 = vpminsd_avx(auVar10,auVar11);
          local_12a0._0_16_ = auVar9;
          auVar9 = vcmpps_avx(auVar9,auVar10,2);
          uVar15 = vmovmskps_avx(auVar9);
          if (uVar15 == 0) goto LAB_0161c87c;
          uVar23 = (ulong)(uVar15 & 0xff);
          auVar32 = ZEXT3264(CONCAT428(0x7f800000,
                                       CONCAT424(0x7f800000,
                                                 CONCAT420(0x7f800000,
                                                           CONCAT416(0x7f800000,
                                                                     CONCAT412(0x7f800000,
                                                                               CONCAT48(0x7f800000,
                                                                                                                                                                                
                                                  0x7f8000007f800000)))))));
          uVar24 = 0;
          uVar18 = 8;
          do {
            lVar22 = 0;
            for (uVar19 = uVar23; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
              lVar22 = lVar22 + 1;
            }
            uVar16 = *(undefined4 *)(uVar17 + 0x20 + lVar22 * 4);
            auVar33._4_4_ = uVar16;
            auVar33._0_4_ = uVar16;
            auVar33._8_4_ = uVar16;
            auVar33._12_4_ = uVar16;
            auVar33._16_4_ = uVar16;
            auVar33._20_4_ = uVar16;
            auVar33._24_4_ = uVar16;
            auVar33._28_4_ = uVar16;
            uVar16 = *(undefined4 *)(uVar17 + 0x40 + lVar22 * 4);
            auVar35._4_4_ = uVar16;
            auVar35._0_4_ = uVar16;
            auVar35._8_4_ = uVar16;
            auVar35._12_4_ = uVar16;
            auVar35._16_4_ = uVar16;
            auVar35._20_4_ = uVar16;
            auVar35._24_4_ = uVar16;
            auVar35._28_4_ = uVar16;
            auVar9 = vfmadd213ps_fma(auVar33,auVar55._0_32_,auVar51._0_32_);
            auVar10 = vfmadd213ps_fma(auVar35,auVar56._0_32_,auVar52._0_32_);
            uVar16 = *(undefined4 *)(uVar17 + 0x60 + lVar22 * 4);
            auVar37._4_4_ = uVar16;
            auVar37._0_4_ = uVar16;
            auVar37._8_4_ = uVar16;
            auVar37._12_4_ = uVar16;
            auVar37._16_4_ = uVar16;
            auVar37._20_4_ = uVar16;
            auVar37._24_4_ = uVar16;
            auVar37._28_4_ = uVar16;
            auVar11 = vfmadd213ps_fma(auVar37,auVar57._0_32_,auVar53._0_32_);
            uVar16 = *(undefined4 *)(uVar17 + 0x30 + lVar22 * 4);
            auVar39._4_4_ = uVar16;
            auVar39._0_4_ = uVar16;
            auVar39._8_4_ = uVar16;
            auVar39._12_4_ = uVar16;
            auVar39._16_4_ = uVar16;
            auVar39._20_4_ = uVar16;
            auVar39._24_4_ = uVar16;
            auVar39._28_4_ = uVar16;
            auVar5 = vfmadd213ps_fma(auVar39,auVar55._0_32_,auVar51._0_32_);
            uVar16 = *(undefined4 *)(uVar17 + 0x50 + lVar22 * 4);
            auVar45._4_4_ = uVar16;
            auVar45._0_4_ = uVar16;
            auVar45._8_4_ = uVar16;
            auVar45._12_4_ = uVar16;
            auVar45._16_4_ = uVar16;
            auVar45._20_4_ = uVar16;
            auVar45._24_4_ = uVar16;
            auVar45._28_4_ = uVar16;
            uVar16 = *(undefined4 *)(uVar17 + 0x70 + lVar22 * 4);
            auVar48._4_4_ = uVar16;
            auVar48._0_4_ = uVar16;
            auVar48._8_4_ = uVar16;
            auVar48._12_4_ = uVar16;
            auVar48._16_4_ = uVar16;
            auVar48._20_4_ = uVar16;
            auVar48._24_4_ = uVar16;
            auVar48._28_4_ = uVar16;
            auVar6 = vfmadd213ps_fma(auVar45,auVar56._0_32_,auVar52._0_32_);
            auVar40 = vfmadd213ps_fma(auVar48,auVar57._0_32_,auVar53._0_32_);
            auVar36 = vpminsd_avx2(ZEXT1632(auVar9),ZEXT1632(auVar5));
            auVar29 = vpminsd_avx2(ZEXT1632(auVar10),ZEXT1632(auVar6));
            auVar36 = vpmaxsd_avx2(auVar36,auVar29);
            auVar29 = vpminsd_avx2(ZEXT1632(auVar11),ZEXT1632(auVar40));
            auVar29 = vpmaxsd_avx2(auVar29,local_fc0);
            auVar36 = vpmaxsd_avx2(auVar36,auVar29);
            auVar29 = vpmaxsd_avx2(ZEXT1632(auVar9),ZEXT1632(auVar5));
            auVar4 = vpmaxsd_avx2(ZEXT1632(auVar10),ZEXT1632(auVar6));
            auVar4 = vpminsd_avx2(auVar29,auVar4);
            auVar29 = vpmaxsd_avx2(ZEXT1632(auVar11),ZEXT1632(auVar40));
            auVar29 = vpminsd_avx2(auVar29,local_12c0);
            auVar29 = vpminsd_avx2(auVar4,auVar29);
            auVar36 = vcmpps_avx(auVar36,auVar29,2);
            uVar19 = uVar18;
            if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar36 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar36 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar36 >> 0x7f,0) != '\0') ||
                  (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar36 >> 0xbf,0) != '\0') ||
                (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar36[0x1f] < '\0') {
              uVar16 = *(undefined4 *)(local_12a0 + lVar22 * 4);
              auVar28._4_4_ = uVar16;
              auVar28._0_4_ = uVar16;
              auVar28._8_4_ = uVar16;
              auVar28._12_4_ = uVar16;
              auVar34._16_4_ = uVar16;
              auVar34._0_16_ = auVar28;
              auVar34._20_4_ = uVar16;
              auVar34._24_4_ = uVar16;
              auVar34._28_4_ = uVar16;
              uVar19 = *(ulong *)(uVar17 + lVar22 * 8);
              auVar36 = vcmpps_avx(auVar34,auVar32._0_32_,1);
              if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar36 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar36 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar36 >> 0x7f,0) == '\0') &&
                    (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar36 >> 0xbf,0) == '\0') &&
                  (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar36[0x1f]) {
                *puVar21 = uVar19;
                uVar19 = uVar18;
              }
              else {
                if (uVar18 == 8) {
                  auVar32 = ZEXT3264(auVar34);
                  goto LAB_0161caa2;
                }
                *puVar21 = uVar18;
                auVar28 = auVar32._0_16_;
                auVar32 = ZEXT3264(auVar34);
              }
              uVar24 = uVar24 + 1;
              *(int *)(puVar21 + 1) = auVar28._0_4_;
              puVar21 = puVar21 + 2;
            }
LAB_0161caa2:
            uVar23 = uVar23 - 1 & uVar23;
            uVar18 = uVar19;
          } while (uVar23 != 0);
          if (uVar19 == 8) goto LAB_0161c87c;
          uVar17 = uVar19;
          if (1 < uVar24) {
            puVar1 = puVar21 + -4;
            puVar2 = puVar21 + -2;
            if ((uint)puVar21[-3] < (uint)puVar21[-1]) {
              uVar18 = *puVar1;
              uVar23 = puVar21[-3];
              *(int *)(puVar21 + -3) = (int)puVar21[-1];
              *puVar1 = *puVar2;
              *puVar2 = uVar18;
              local_1350.geometryUserPtr._0_4_ = (undefined4)uVar23;
              *(undefined4 *)(puVar21 + -1) = local_1350.geometryUserPtr._0_4_;
            }
            if (uVar24 != 2) {
              puVar3 = puVar21 + -6;
              uVar15 = (uint)puVar21[-5];
              if (uVar15 < (uint)puVar21[-1]) {
                uVar18 = *puVar3;
                uVar23 = puVar21[-5];
                *(int *)(puVar21 + -5) = (int)puVar21[-1];
                *puVar3 = *puVar2;
                *puVar2 = uVar18;
                local_1350.geometryUserPtr._0_4_ = (undefined4)uVar23;
                *(undefined4 *)(puVar21 + -1) = local_1350.geometryUserPtr._0_4_;
                uVar15 = (uint)puVar21[-5];
              }
              if (uVar15 < (uint)puVar21[-3]) {
                uVar18 = *puVar3;
                uVar23 = puVar21[-5];
                *(int *)(puVar21 + -5) = (int)puVar21[-3];
                *puVar3 = *puVar1;
                *puVar1 = uVar18;
                local_1350.geometryUserPtr._0_4_ = (undefined4)uVar23;
                *(undefined4 *)(puVar21 + -3) = local_1350.geometryUserPtr._0_4_;
              }
            }
          }
        }
        local_fe0 = vcmpps_avx(local_12c0,auVar32._0_32_,6);
        auVar32 = ZEXT3264(local_fe0);
      } while ((((((((local_fe0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                    (local_fe0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (local_fe0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  SUB321(local_fe0 >> 0x7f,0) == '\0') &&
                 (local_fe0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                SUB321(local_fe0 >> 0xbf,0) == '\0') &&
               (local_fe0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               -1 < local_fe0[0x1f]);
      lVar22 = (ulong)((uint)uVar17 & 0xf) - 8;
      local_12e0 = lVar22;
      for (local_12d8 = 0; auVar36 = auVar32._0_32_, lVar22 != local_12d8;
          local_12d8 = local_12d8 + 1) {
        local_1350.geomID = *(uint *)((uVar17 & 0xfffffffffffffff0) + local_12d8 * 8);
        local_1320 = (context->scene->geometries).items[local_1350.geomID].ptr;
        uVar15 = local_1320->mask;
        auVar31._4_4_ = uVar15;
        auVar31._0_4_ = uVar15;
        auVar31._8_4_ = uVar15;
        auVar31._12_4_ = uVar15;
        auVar31._16_4_ = uVar15;
        auVar31._20_4_ = uVar15;
        auVar31._24_4_ = uVar15;
        auVar31._28_4_ = uVar15;
        auVar29 = vpand_avx2(auVar31,*(undefined1 (*) [32])(ray + 0x120));
        auVar4 = vpcmpeqd_avx2(auVar54._0_32_,auVar29);
        auVar29 = auVar36 & ~auVar4;
        if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar29 >> 0x7f,0) != '\0') ||
              (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar29 >> 0xbf,0) != '\0') ||
            (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar29[0x1f] < '\0') {
          local_12a0 = vandnps_avx(auVar4,auVar36);
          local_1350.primID = *(uint *)((uVar17 & 0xfffffffffffffff0) + 4 + local_12d8 * 8);
          local_1350.valid = (int *)local_12a0;
          local_1350.geometryUserPtr = local_1320->userPtr;
          local_1350.context = context->user;
          local_1350.N = 8;
          local_1318 = 0;
          local_1310 = context->args;
          pp_Var20 = (_func_int **)local_1310->intersect;
          if (pp_Var20 == (_func_int **)0x0) {
            pp_Var20 = local_1320[1].super_RefCount._vptr_RefCount;
          }
          local_1350.rayhit = (RTCRayHitN *)ray;
          (*(code *)pp_Var20)(&local_1350);
          auVar55 = ZEXT3264(local_1000);
          auVar56 = ZEXT3264(local_1020);
          auVar57 = ZEXT3264(local_1040);
          auVar54 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar51 = ZEXT3264(CONCAT428(uStack_1104,
                                       CONCAT424(fStack_1108,
                                                 CONCAT420(fStack_110c,
                                                           CONCAT416(fStack_1110,
                                                                     CONCAT412(fStack_1114,
                                                                               CONCAT48(fStack_1118,
                                                                                        CONCAT44(
                                                  fStack_111c,local_1120))))))));
          auVar52 = ZEXT3264(CONCAT428(uStack_1124,
                                       CONCAT424(fStack_1128,
                                                 CONCAT420(fStack_112c,
                                                           CONCAT416(fStack_1130,
                                                                     CONCAT412(fStack_1134,
                                                                               CONCAT48(fStack_1138,
                                                                                        CONCAT44(
                                                  fStack_113c,local_1140))))))));
          auVar53 = ZEXT3264(CONCAT428(uStack_1144,
                                       CONCAT424(fStack_1148,
                                                 CONCAT420(fStack_114c,
                                                           CONCAT416(fStack_1150,
                                                                     CONCAT412(fStack_1154,
                                                                               CONCAT48(fStack_1158,
                                                                                        CONCAT44(
                                                  fStack_115c,local_1160))))))));
          auVar32 = ZEXT3264(local_fe0);
          context = local_12f0;
          ray = local_12f8;
          lVar22 = local_12e0;
          uVar25 = local_12e8;
        }
      }
      auVar29 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),local_12c0,1);
      auVar29 = auVar36 & auVar29;
    } while ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                  (auVar29 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar29 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                SUB321(auVar29 >> 0x7f,0) == '\0') &&
               (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              SUB321(auVar29 >> 0xbf,0) == '\0') &&
             (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             -1 < auVar29[0x1f]);
    local_12c0 = vblendvps_avx(local_12c0,*(undefined1 (*) [32])(ray + 0x100),auVar36);
    auVar36 = vshufps_avx(local_12c0,local_12c0,0xb1);
    auVar36 = vmaxps_avx(local_12c0,auVar36);
    auVar29 = vshufpd_avx(auVar36,auVar36,5);
    auVar36 = vmaxps_avx(auVar36,auVar29);
    auVar6 = vmaxss_avx(auVar36._0_16_,auVar36._16_16_);
  } while( true );
}

Assistant:

static __forceinline vboolf8 operator ==(const vint8& a, const vint8& b) { return _mm256_castsi256_ps(_mm256_cmpeq_epi32(a, b)); }